

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O0

bool __thiscall lan::db::get<bool>(db *this,string *context,string *name,db_bit_type type)

{
  db_bits *pdVar1;
  db_bit *pdVar2;
  invalid_argument *this_00;
  bool bVar3;
  string local_c0;
  string local_a0;
  bool *data_p;
  string local_48;
  db_bit_type local_24;
  string *psStack_20;
  db_bit_type type_local;
  string *name_local;
  string *context_local;
  db *this_local;
  
  local_24 = type;
  psStack_20 = name;
  name_local = context;
  context_local = (string *)this;
  std::__cxx11::string::string((string *)&local_48,(string *)context);
  pdVar1 = find_rec(this,&local_48,Container,this->first);
  this->data = pdVar1;
  std::__cxx11::string::~string((string *)&local_48);
  if (pdVar1 != (db_bits *)0x0) {
    std::__cxx11::string::string((string *)&data_p,(string *)name);
    pdVar2 = find_any(this,(string *)&data_p,local_24,this->data->lin);
    this->data = pdVar2;
    bVar3 = false;
    if (pdVar2 != (db_bit *)0x0) {
      bVar3 = this->data->data != (void *)0x0;
    }
    std::__cxx11::string::~string((string *)&data_p);
    if (bVar3) {
      return (bool)(*this->data->data & 1);
    }
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_c0,(string *)name);
  error_string(&local_a0,this,_bit_name_error,&local_c0);
  std::invalid_argument::invalid_argument(this_00,(string *)&local_a0);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

any get(std::string context, std::string const name, const lan::db_bit_type type){
            if ((data = find_rec(context, lan::Container, first))) {
                if((data = find_any(name, type, data->lin)) and data->data){
                    any * data_p = (any*)data->data;
                    return ((any&)*data_p);
                }
            } throw lan::errors::bit_name_error(error_string(errors::_private::_bit_name_error, name));
        }